

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# userauth.c
# Opt level: O1

int sign_frommemory(LIBSSH2_SESSION *session,uchar **sig,size_t *sig_len,uchar *data,size_t data_len
                   ,void **abstract)

{
  undefined8 *puVar1;
  uchar *__s2;
  size_t __n;
  int iVar2;
  LIBSSH2_HOSTKEY_METHOD **ppLVar3;
  char *pcVar4;
  LIBSSH2_HOSTKEY_METHOD *pLVar5;
  void *hostkey_abstract;
  iovec datavec;
  void *local_78;
  uchar *local_70;
  size_t local_68;
  uchar **local_60;
  size_t *local_58;
  size_t local_50;
  uchar *local_48;
  iovec local_40;
  
  puVar1 = (undefined8 *)*abstract;
  __s2 = session->userauth_pblc_method;
  __n = session->userauth_pblc_method_len;
  pcVar4 = (char *)*puVar1;
  local_70 = data;
  local_68 = data_len;
  local_60 = sig;
  local_58 = sig_len;
  local_50 = strlen(pcVar4);
  local_48 = (uchar *)puVar1[1];
  ppLVar3 = libssh2_hostkey_methods();
  local_78 = (void *)0x0;
  pLVar5 = *ppLVar3;
  while (pLVar5 != (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    ppLVar3 = ppLVar3 + 1;
    if (pLVar5->name == (char *)0x0) break;
    if ((pLVar5->initPEMFromMemory !=
         (_func_int_LIBSSH2_SESSION_ptr_char_ptr_size_t_uchar_ptr_void_ptr_ptr *)0x0) &&
       (iVar2 = strncmp(pLVar5->name,(char *)__s2,__n), iVar2 == 0)) goto LAB_0011ae16;
    pLVar5 = *ppLVar3;
  }
  pLVar5 = (LIBSSH2_HOSTKEY_METHOD *)0x0;
LAB_0011ae16:
  if (pLVar5 == (LIBSSH2_HOSTKEY_METHOD *)0x0) {
    pcVar4 = "No handler for specified private key";
    iVar2 = -0x11;
  }
  else {
    iVar2 = (*pLVar5->initPEMFromMemory)(session,pcVar4,local_50,local_48,&local_78);
    if (iVar2 == 0) {
      iVar2 = 0;
      goto LAB_0011ae61;
    }
    pcVar4 = "Unable to initialize private key from memory";
    iVar2 = -0x10;
  }
  iVar2 = _libssh2_error(session,iVar2,pcVar4);
LAB_0011ae61:
  if (iVar2 == 0) {
    local_40.iov_base = local_70;
    local_40.iov_len = local_68;
    iVar2 = (*pLVar5->signv)(session,local_60,local_58,1,&local_40,&local_78);
    iVar2 = -(uint)(iVar2 != 0);
    if (pLVar5->dtor != (_func_int_LIBSSH2_SESSION_ptr_void_ptr_ptr *)0x0) {
      (*pLVar5->dtor)(session,&local_78);
    }
  }
  return iVar2;
}

Assistant:

static int
sign_frommemory(LIBSSH2_SESSION *session, unsigned char **sig, size_t *sig_len,
                const unsigned char *data, size_t data_len, void **abstract)
{
    struct privkey_file *pk_file = (struct privkey_file *) (*abstract);
    const LIBSSH2_HOSTKEY_METHOD *privkeyobj;
    void *hostkey_abstract;
    struct iovec datavec;
    int rc;

    rc = memory_read_privatekey(session, &privkeyobj, &hostkey_abstract,
                                session->userauth_pblc_method,
                                session->userauth_pblc_method_len,
                                pk_file->filename,
                                strlen(pk_file->filename),
                                pk_file->passphrase);
    if(rc)
        return rc;

    libssh2_prepare_iovec(&datavec, 1);
    datavec.iov_base = (void *)data;
    datavec.iov_len  = data_len;

    if(privkeyobj->signv(session, sig, sig_len, 1, &datavec,
                         &hostkey_abstract)) {
        if(privkeyobj->dtor) {
            privkeyobj->dtor(session, &hostkey_abstract);
        }
        return -1;
    }

    if(privkeyobj->dtor) {
        privkeyobj->dtor(session, &hostkey_abstract);
    }
    return 0;
}